

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPTCPTransmitter::ClearDestSockets(RTPTCPTransmitter *this)

{
  bool bVar1;
  pointer ppVar2;
  uint8_t *buf;
  RTPMemoryManager *mgr;
  uint8_t *pBuf;
  iterator end;
  iterator it;
  RTPTCPTransmitter *this_local;
  
  end = std::
        map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
        ::begin(&this->m_destSockets);
  pBuf = (uint8_t *)
         std::
         map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
         ::end(&this->m_destSockets);
  while( true ) {
    bVar1 = std::operator!=(&end,(_Self *)&pBuf);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>::
             operator->(&end);
    buf = SocketData::ExtractDataBuffer(&ppVar2->second);
    if (buf != (uint8_t *)0x0) {
      mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      RTPDeleteByteArray(buf,mgr);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>::
    operator++(&end);
  }
  std::
  map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
  ::clear(&this->m_destSockets);
  return;
}

Assistant:

void RTPTCPTransmitter::ClearDestSockets()
{
	std::map<SocketType, SocketData>::iterator it = m_destSockets.begin();
	std::map<SocketType, SocketData>::iterator end = m_destSockets.end();

	while (it != end)
	{
		uint8_t *pBuf = it->second.ExtractDataBuffer();
		if (pBuf)
			RTPDeleteByteArray(pBuf, GetMemoryManager());

		++it;
	}
	m_destSockets.clear();
}